

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RewriteCorrelatedExpressions::VisitReplace
          (RewriteCorrelatedExpressions *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  long lVar1;
  pointer pcVar2;
  iterator iVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  
  if ((Expression *)
      (expr->super_Expression).super_BaseExpression.alias.field_2._M_allocated_capacity <
      expr_ptr[0xd].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl) {
    iVar3 = ::std::
            _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(expr->super_Expression).super_BaseExpression.alias._M_string_length,
                   (key_type *)(expr_ptr + 0xb));
    lVar1 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
                            ._M_cur + 0x18);
    pcVar2 = (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
    expr_ptr[0xb].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         *(Expression **)&(expr->super_Expression).super_BaseExpression.type;
    expr_ptr[0xc].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)(pcVar2 + lVar1)
    ;
    _Var4._M_head_impl = (Expression *)0x0;
    if ((expr->super_Expression).super_BaseExpression.alias.field_2._M_local_buf[8] != '\0') {
      _Var4._M_head_impl =
           (Expression *)
           ((long)(expr_ptr[0xd].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                  0xffffffffffffffff) + 0x57);
    }
    expr_ptr[0xd].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> RewriteCorrelatedExpressions::VisitReplace(BoundColumnRefExpression &expr,
                                                                  unique_ptr<Expression> *expr_ptr) {
	if (expr.depth <= lateral_depth) {
		// Indicates local correlations not relevant for the current the rewrite
		return nullptr;
	}
	// correlated column reference
	// replace with the entry referring to the duplicate eliminated scan
	// if this assertion occurs it generally means the bindings are inappropriate set in the binder or
	// we either missed to account for lateral binder or over-counted for the lateral binder
	D_ASSERT(expr.depth == 1 + lateral_depth);
	auto entry = correlated_map.find(expr.binding);
	D_ASSERT(entry != correlated_map.end());

	expr.binding = ColumnBinding(base_binding.table_index, base_binding.column_index + entry->second);
	if (recursive_rewrite) {
		D_ASSERT(expr.depth > 1);
		expr.depth--;
	} else {
		expr.depth = 0;
	}
	return nullptr;
}